

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  int g_a_00;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  long lVar20;
  uint uVar21;
  double dVar22;
  double dVar23;
  int size_c;
  int size_b;
  int size_a;
  int test_buf;
  int *c_buf;
  int *b_buf;
  int *a_buf;
  int ld;
  int elemsize;
  int offset;
  int num_blocks;
  int lds;
  int hiS [2];
  int loS [2];
  int *subarray_test;
  int *fullarray_test;
  int sub_size;
  char *read_cache;
  char *read_only;
  int ldC;
  int nlo;
  int lda;
  int ldc;
  int ldb;
  int dims [2];
  int hiB [2];
  int loB [2];
  int hiA [2];
  int loA [2];
  int hiC [2];
  int loC [2];
  int chi [2];
  int clo [2];
  int bhi [2];
  int blo [2];
  int ahi [2];
  int alo [2];
  int full_size;
  int *ctest;
  int *cbuf;
  int *bbuf;
  int *abuf;
  int dimsize;
  int test;
  double delta_t;
  int *local_res130;
  int *local_res138;
  int ldtest;
  int local_test;
  int istart;
  int ind;
  int nb;
  int ycnt;
  int xcnt;
  int ynbl;
  int xnbl;
  int ycdim;
  int xcdim;
  int ybl;
  int xbl;
  int ydim;
  int xdim;
  int pdy;
  int pdx;
  int ipy;
  int ipx;
  int k;
  int j;
  int i;
  int kdim;
  int nprocs;
  int rank;
  int one;
  int g_c;
  int g_b;
  int g_a;
  int *in_stack_00000660;
  int *in_stack_00000668;
  int in_stack_00000674;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Integer in_stack_fffffffffffffe50;
  Integer in_stack_fffffffffffffe58;
  int local_188;
  int local_118;
  uint local_10c;
  uint local_a8;
  int local_a4;
  int local_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_58;
  uint local_54;
  int local_48;
  int local_44;
  int local_38;
  int local_34;
  int local_30;
  int local_28;
  uint local_24 [3];
  int local_18;
  int local_14;
  undefined1 local_10 [8];
  undefined1 local_8 [4];
  int local_4;
  
  local_4 = 0;
  local_24[1] = 1;
  MPI_Init(local_8,local_10);
  MPI_Comm_rank(&ompi_mpi_comm_world,local_24);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_28);
  MA_init(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  GA_Initialize();
  local_28 = GA_Nnodes();
  local_24[0] = GA_Nodeid();
  for (local_a4 = 0; local_a4 < 2; local_a4 = local_a4 + 1) {
    for (local_a8 = 4; (int)local_a8 < 0x1001; local_a8 = local_a8 << 1) {
      if (local_24[0] == 0) {
        fprintf(_stderr,"dim:%d start\n",(ulong)local_a8);
      }
      g_a_00 = local_a8 * local_a8;
      uVar1 = 0;
      iVar2 = local_a8 - 1;
      iVar3 = local_a8 - 1;
      iVar4 = 0;
      uVar5 = 0;
      iVar6 = local_a8 - 1;
      iVar7 = local_a8 - 1;
      iVar8 = 0;
      uVar9 = 0;
      iVar10 = local_a8 - 1;
      iVar11 = 0;
      iVar12 = 0;
      iVar13 = local_a8 - 1;
      uVar14 = 0;
      uVar15 = 0;
      iVar16 = local_a8 - 1;
      iVar17 = local_a8 - 1;
      uVar21 = local_a8;
      malloc((long)g_a_00 << 2);
      __ptr = malloc((long)g_a_00 << 2);
      for (local_30 = 0; local_30 < g_a_00; local_30 = local_30 + 1) {
        *(int *)((long)__ptr + (long)local_30 * 4) = local_30;
      }
      __ptr_00 = malloc((long)g_a_00 << 2);
      for (local_30 = 0; local_30 < g_a_00; local_30 = local_30 + 1) {
        *(int *)((long)__ptr_00 + (long)local_30 * 4) = local_30;
      }
      local_14 = NGA_Create(iVar12,iVar11,(int *)CONCAT44(iVar13,uVar15),
                            (char *)CONCAT44(uVar14,iVar17),(int *)CONCAT44(iVar16,uVar21));
      local_18 = NGA_Create(iVar12,iVar11,(int *)CONCAT44(iVar13,uVar15),
                            (char *)CONCAT44(uVar14,iVar17),(int *)CONCAT44(iVar16,uVar21));
      local_24[2] = NGA_Create(iVar12,iVar11,(int *)CONCAT44(iVar13,uVar15),
                               (char *)CONCAT44(uVar14,iVar17),(int *)CONCAT44(iVar16,uVar21));
      GA_Zero(in_stack_fffffffffffffe44);
      GA_Zero(in_stack_fffffffffffffe44);
      GA_Zero(in_stack_fffffffffffffe44);
      NGA_Put(g_a_00,(int *)CONCAT44(uVar1,iVar3),(int *)CONCAT44(iVar2,uVar5),
              (void *)CONCAT44(iVar4,iVar7),(int *)CONCAT44(iVar6,uVar9));
      NGA_Put(g_a_00,(int *)CONCAT44(uVar1,iVar3),(int *)CONCAT44(iVar2,uVar5),
              (void *)CONCAT44(iVar4,iVar7),(int *)CONCAT44(iVar6,uVar9));
      GA_Sync();
      if (local_a4 == 0) {
        NGA_Set_property(in_stack_fffffffffffffe44,
                         (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        NGA_Set_property(in_stack_fffffffffffffe44,
                         (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      if (local_a4 == 1) {
        NGA_Set_property(in_stack_fffffffffffffe44,
                         (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        NGA_Set_property(in_stack_fffffffffffffe44,
                         (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      GA_Sync();
      dVar22 = GA_Wtime();
      grid_factor(in_stack_00000674,in_stack_00000668,in_stack_00000660);
      uVar21 = (int)local_24[0] % local_44;
      local_70 = (int)(local_24[0] - uVar21) / local_44;
      local_54 = (int)local_a8 / 2;
      local_58 = (int)local_a8 / 2;
      local_64 = (int)local_a8 / (int)local_54;
      local_68 = (int)local_a8 / local_58;
      if ((int)(local_64 * local_54) < (int)local_a8) {
        local_64 = local_64 + 1;
      }
      if (local_68 * local_58 < (int)local_a8) {
        local_68 = local_68 + 1;
      }
      GA_Sync();
      local_6c = uVar21;
      while (local_70 < local_68) {
        uVar18 = local_6c * local_54;
        iVar11 = local_70 * local_58;
        local_10c = (local_6c + 1) * local_54 - 1;
        iVar12 = (local_70 + 1) * local_58 + -1;
        if ((int)local_a8 <= (int)local_10c) {
          local_10c = local_a8 - 1;
        }
        if ((int)local_a8 <= (int)local_10c) {
          local_10c = local_a8 - 1;
        }
        if ((int)local_10c < (int)uVar18) {
          fprintf(_stderr,"%d: bad values for HiC LoC: %d  %d\n",(ulong)local_24[0],(ulong)local_10c
                  ,(ulong)uVar18);
          fprintf(_stderr,"%dL xcnt xbl: %d  %d\n",(ulong)local_24[0],(ulong)local_6c,
                  (ulong)local_54);
          GA_Error((char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe3c);
        }
        local_188 = (int)local_a8 / (int)((local_10c - uVar18) + 1);
        if ((int)(local_188 * ((local_10c - uVar18) + 1)) < (int)local_a8) {
          local_188 = local_188 + 1;
        }
        __ptr_01 = malloc((long)(int)(((local_10c - uVar18) + 1) * ((iVar12 - iVar11) + 1) * 4));
        __ptr_02 = malloc((long)(int)(((local_10c - uVar18) + 1) * ((iVar12 - iVar11) + 1) * 4));
        __ptr_03 = malloc((long)(int)(((local_10c - uVar18) + 1) * ((iVar12 - iVar11) + 1) * 4));
        in_stack_fffffffffffffe40 = ((local_10c - uVar18) + 1) * ((iVar12 - iVar11) + 1);
        iVar13 = uVar18 - iVar8;
        for (local_74 = 0; local_74 < local_188; local_74 = local_74 + 1) {
          iVar17 = (iVar13 / (int)((local_10c - uVar18) + 1) + local_74) % local_188;
          iVar16 = iVar17 * ((local_10c - uVar18) + 1);
          local_118 = iVar16 + (local_10c - uVar18);
          if (iVar3 < local_118) {
            local_118 = iVar3;
          }
          NGA_Get(g_a_00,(int *)CONCAT44(uVar1,iVar3),(int *)CONCAT44(iVar2,uVar5),
                  (void *)CONCAT44(iVar4,iVar7),(int *)CONCAT44(iVar6,uVar9));
          if (4 < (int)local_a8) {
            malloc((long)(int)(((local_10c - uVar18) + -1) * ((iVar12 - iVar11) + -1)) << 2);
            NGA_Get(g_a_00,(int *)CONCAT44(uVar1,iVar3),(int *)CONCAT44(iVar2,uVar5),
                    (void *)CONCAT44(iVar4,iVar7),(int *)CONCAT44(iVar6,uVar9));
          }
          iVar19 = iVar4 + iVar17 * ((local_10c - uVar18) + 1);
          iVar17 = iVar19 + (local_10c - uVar18);
          if (iVar6 < iVar17) {
            iVar17 = iVar6;
          }
          in_stack_fffffffffffffe44 = ((iVar17 - iVar19) + 1) * ((iVar12 - iVar11) + 1);
          NGA_Get(g_a_00,(int *)CONCAT44(uVar1,iVar3),(int *)CONCAT44(iVar2,uVar5),
                  (void *)CONCAT44(iVar4,iVar7),(int *)CONCAT44(iVar6,uVar9));
          iVar17 = (local_10c - uVar18) + 1;
          iVar19 = (iVar12 - iVar11) + 1;
          for (local_30 = 0; local_30 < iVar17; local_30 = local_30 + 1) {
            for (local_34 = 0; local_34 < iVar19; local_34 = local_34 + 1) {
              *(undefined4 *)((long)__ptr_01 + (long)(local_30 * iVar19 + local_34) * 4) = 0;
            }
          }
          iVar16 = (local_118 - iVar16) + 1;
          for (local_30 = 0; local_30 < iVar17; local_30 = local_30 + 1) {
            for (local_34 = 0; local_34 < iVar19; local_34 = local_34 + 1) {
              for (local_38 = 0; local_38 < iVar16; local_38 = local_38 + 1) {
                lVar20 = (long)(local_30 * iVar19 + local_34);
                *(int *)((long)__ptr_01 + lVar20 * 4) =
                     *(int *)((long)__ptr_02 + (long)(local_30 * iVar16 + local_38) * 4) *
                     *(int *)((long)__ptr_03 + (long)(local_38 * iVar19 + local_34) * 4) +
                     *(int *)((long)__ptr_01 + lVar20 * 4);
              }
            }
          }
          NGA_Acc(g_a_00,(int *)CONCAT44(uVar1,iVar3),(int *)CONCAT44(iVar2,uVar5),
                  (void *)CONCAT44(iVar4,iVar7),(int *)CONCAT44(iVar6,uVar9),
                  (void *)CONCAT44(iVar8,iVar10));
        }
        free(__ptr_02);
        free(__ptr_03);
        free(__ptr_01);
        local_6c = local_44 + local_6c;
        if (local_64 <= (int)local_6c) {
          local_70 = local_48 + local_70;
          local_6c = uVar21;
        }
      }
      dVar23 = GA_Wtime();
      if (local_a8 == 0 && local_24[0] == 0) {
        printf("\n");
      }
      if ((local_a4 == 0) && (local_24[0] == 0)) {
        printf("READ  - DIMSIZE: %5d  Time (us): %7.4f\n",(dVar23 - dVar22) * 1000000.0,
               (ulong)local_a8);
      }
      if ((local_a4 == 1) && (local_24[0] == 0)) {
        printf("CACHE - DIMSIZE: %5d  Time (us): %7.4f\n",(dVar23 - dVar22) * 1000000.0,
               (ulong)local_a8);
      }
      GA_Sync();
      NGA_Unset_property(in_stack_fffffffffffffe44);
      NGA_Unset_property(in_stack_fffffffffffffe44);
      GA_Destroy(in_stack_fffffffffffffe44);
      GA_Destroy(in_stack_fffffffffffffe44);
      GA_Destroy(in_stack_fffffffffffffe44);
      free(__ptr);
      free(__ptr_00);
    }
  }
  GA_Terminate();
  MPI_Finalize();
  return local_4;
}

Assistant:

int main(int argc, char **argv) {

  int g_a, g_b, g_c;
  int one = 1;
  int rank, nprocs, kdim;
  int i, j, k;
  int ipx, ipy;
  int pdx, pdy;
  int xdim, ydim;
  int xbl, ybl;
  int xcdim, ycdim;
  int xnbl, ynbl;
  int xcnt, ycnt;
  int nb, ind, istart;
  int local_test;
  int ldtest = 5;
  int *local_A = NULL;
  int *local_B = NULL;
  double delta_t;
  int test;
  int dimsize;

  MPI_Init(&argc, &argv);

  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &nprocs);

  MA_init(C_INT, 1000, 1000);
  GA_Initialize();

  nprocs = GA_Nnodes();  
  rank = GA_Nodeid();   

  for (test = 0; test <= 1; test++) {
    for (dimsize = 4; dimsize <=4096; dimsize *= 2){
      if (rank == 0) fprintf(stderr,"dim:%d start\n",dimsize);

      int *abuf, *bbuf, *cbuf, *ctest;
      int full_size = dimsize*dimsize;
      int alo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int ahi[DIM] = {dimsize-1,dimsize-1};
      int blo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int bhi[DIM] = {dimsize-1,dimsize-1};
      int clo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int chi[DIM] = {dimsize-1,dimsize-1};
      int loC[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiC[DIM] = {dimsize-1,dimsize-1};
      int loA[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiA[DIM] = {dimsize-1,dimsize-1};
      int loB[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiB[DIM] = {dimsize-1,dimsize-1};
      int dims[DIM]={dimsize,dimsize};
      int ldb = hiB[0]-loB[0]+1;
      int ldc = hiC[0]-loC[0]+1;
      int lda = hiA[0]-loA[0]+1;
      int nlo, ldC;

      char* read_only = "read_only";
      char* read_cache = "read_cache";

      //subarray variables
      int sub_size;
      int *fullarray_test = (int*)malloc(full_size*sizeof(int));
      int *subarray_test;
      int loS[DIM], hiS[DIM];
      int lds;

      local_A=(int*)malloc(full_size*sizeof(int));
      for (i=0;i<full_size;i++){
        *(local_A + i) = i;
      }

      local_B=(int*)malloc(full_size*sizeof(int));
      for (i=0; i<full_size; i++){
        *(local_B + i) = i;
      }

      g_a = NGA_Create(C_INT, DIM, dims, "array_A", NULL);
      g_b = NGA_Create(C_INT, DIM, dims, "array_B", NULL);
      g_c = NGA_Create(C_INT, DIM, dims, "array_C", NULL);

      //fill GAs a and b with values to be multipled
      GA_Zero(g_a);
      GA_Zero(g_b);
      GA_Zero(g_c);

      NGA_Put(g_a, alo, ahi, local_A, &lda);
      NGA_Put(g_b, blo, bhi, local_B, &ldb);

      GA_Sync();
 
      if (test == 0) {
      NGA_Set_property(g_a, read_only);
      NGA_Set_property(g_b, read_only);
      }      
      if (test == 1) {
        NGA_Set_property(g_a, read_cache);
        NGA_Set_property(g_b, read_cache);
      }

      GA_Sync();

      delta_t = GA_Wtime();

      grid_factor(nprocs, &pdx, &pdy);

      //coordinates of processor for grid
      ipx = rank%pdx;
      ipy = (rank-ipx)/pdx; 
      xdim = dimsize;
      ydim = dimsize;

      if (dimsize <= 64) {
        xbl = dimsize/2;
        ybl = dimsize/2;
      } else {
        xbl = dimsize/2;
        ybl = dimsize/2;
      }

      //total number of blocks on each dimension
      xnbl = xdim/xbl;
      ynbl = ydim/ybl;
      if ((xnbl * xbl) < xdim) xnbl++;
      if ((ynbl * ybl) < ydim) ynbl++;

      xcnt = ipx;
      ycnt = ipy;

      GA_Sync();

      while (ycnt < ynbl) {
        int num_blocks, offset;
        int elemsize, ld;
        int *a_buf = NULL;
        int *b_buf = NULL;
        int *c_buf = NULL;
        int test_buf;
        int size_a, size_b, size_c;

        loC[0] = xcnt * xbl;
        loC[1] = ycnt * ybl;
        hiC[0] = (xcnt + 1) * xbl - 1;
        hiC[1] = (ycnt + 1) * ybl - 1;

        if (hiC[0] >= xdim) hiC[0] = xdim - 1;
        if (hiC[0] >= ydim) hiC[0] = ydim - 1;

	// stop to avoid FPE
	if ( hiC[0] < loC[0] ){
	  fprintf(stderr,"%d: bad values for HiC LoC: %d  %d\n", rank, hiC[0], loC[0]);
	  fprintf(stderr,"%dL xcnt xbl: %d  %d\n", rank, xcnt, xbl);
	  GA_Error("cache_test: div by zero", 0);
	}
        // Calculating number of blocks for inner dimension
        num_blocks = dimsize/(hiC[0]-loC[0]+1);
        if (num_blocks*(hiC[0]-loC[0]+1) < dimsize) num_blocks++;

        //set up buffers
        offset = 0;
        elemsize = sizeof(int);

        c_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        a_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        b_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        
        test_buf = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize;
        size_c = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1);
        ldC = hiC[1]-loC[1]+1;
        
        // calculate starting block index
        istart = (loC[0]-clo[0])/(hiC[0]-loC[0]+1);
        
        // loop over block pairs
        for (nb=0; nb<num_blocks; nb++) {
          
          ind = istart + nb;
          ind = ind%num_blocks;
          
          nlo = alo[1]+ind*(hiC[0]-loC[0]+1);
          loA[0] = loC[0];
          hiA[0] = hiC[0];
          loA[1] = nlo;
          hiA[1] = loA[1]+(hiC[0]-loC[0]);
          if (hiA[1] > ahi[1]) hiA[1] = ahi[1];
          ld = hiA[0]-loA[0]+1;
          size_a = (hiA[0]-loA[0]+1)*(hiA[1]-loA[1]+1);
          
          NGA_Get(g_a,loA,hiA,a_buf,&ld);       
          
          if (dimsize > 4) {
          sub_size = (hiC[0]-loC[0]-1)*(hiC[1]-loC[1]-1);
          subarray_test = (int*)malloc(sub_size*sizeof(int)); 
          
          loS[0] = loA[0]+1;
          loS[1] = loA[1]+1;
          hiS[0] = hiA[0]-1;
          hiS[1] = hiA[1]-1;
          lds = hiS[0]-loS[0]+1;

          NGA_Get(g_a,loS,hiS,subarray_test,&lds);
          }          

          loB[1] = loC[1];
          hiB[1] = hiC[1];
          nlo = blo[0]+ind*(hiC[0]-loC[0]+1);
          loB[0] = nlo;
          hiB[0] = loB[0]+(hiC[0]-loC[0]);
          if (hiB[0] > bhi[0]) hiB[0] = bhi[0];
          ld = hiB[0]-loB[0]+1;
          size_b = (hiB[0]-loB[0]+1)*(hiB[1]-loB[1]+1);        

          NGA_Get(g_b,loB,hiB,b_buf,&ld);

          xcdim = hiC[0] - loC[0] + 1;
          ycdim = hiC[1] - loC[1] + 1;

          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              c_buf[i*ycdim+j] = 0.0;
            }
          }
          //transpose B to reduce page faults
          kdim = hiA[1] - loA[1] + 1;
          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              for (k = 0; k < kdim; k++) {
                c_buf[i*ycdim+j] += a_buf[i*kdim+k]*b_buf[k*ycdim+j];
              }
            }
          }

          NGA_Acc(g_c, loC, hiC, c_buf, &ldC, &one);

        }
         
        // multiplication is done, free buffers 
        free(a_buf);
        free(b_buf);
        free(c_buf);

        xcnt += pdx;

        if (xcnt >= xnbl) {
          xcnt = ipx;
          ycnt += pdy;
        }
      }

      delta_t = GA_Wtime()-delta_t;      
      if (dimsize == 0 & rank == 0) printf("\n"); 
      if (test == 0 && rank == 0) printf("READ  - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);
      if (test == 1 && rank == 0) printf("CACHE - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);

      GA_Sync();
      NGA_Unset_property(g_a);
      NGA_Unset_property(g_b);

#if 0 
      /* check multipy for correctness */
      abuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      bbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      cbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      ctest = (int*)malloc(sizeof(int)*dimsize*dimsize);
      /* get data from matrices a, b, c */
      NGA_Get(g_a,alo,ahi,abuf,&dimsize);
      NGA_Get(g_b,blo,bhi,bbuf,&dimsize);
      NGA_Get(g_c,clo,chi,ctest,&dimsize);
      for (i=0; i<dimsize; i++) {
        for (j=0; j<dimsize; j++) {
          cbuf[i*dimsize+j] = 0;
          for (k=0; k<dimsize; k++) {
            cbuf[i*dimsize+j] += abuf[i*dimsize+k]*bbuf[k*dimsize+j];
          }
          if (cbuf[i*dimsize+j] != ctest[i*dimsize+j] && rank == 0) {
            printf("mismatch for pair [%d,%d] expected: %d actual: %d\n",i,j,
                cbuf[i*dimsize+j],ctest[i*dimsize+j]);
          }
        }
      }
      free(abuf);
      free(bbuf);
      free(cbuf);
      free(ctest);
#endif

      GA_Destroy(g_a);
      GA_Destroy(g_b);
      GA_Destroy(g_c);
      free(local_A);
      free(local_B);     
    }
  }
  GA_Terminate();
  MPI_Finalize();
}